

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O3

void duckdb::CanCastImplicitlyFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ClientContext *pCVar1;
  reference pvVar2;
  LogicalType *pLVar3;
  Value v;
  Value local_60 [64];
  
  pCVar1 = (ClientContext *)duckdb::ExpressionState::GetContext();
  pvVar2 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pLVar3 = (LogicalType *)duckdb::CastFunctionSet::Get(pCVar1);
  duckdb::CastFunctionSet::ImplicitCastCost(pLVar3,(LogicalType *)(pvVar2 + 8));
  duckdb::Value::BOOLEAN(SUB81(local_60,0));
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_60);
  return;
}

Assistant:

static void CanCastImplicitlyFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	bool can_cast_implicitly = CanCastImplicitly(context, args.data[0].GetType(), args.data[1].GetType());
	auto v = Value::BOOLEAN(can_cast_implicitly);
	result.Reference(v);
}